

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::color4h>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *result)

{
  pointer *ppcVar1;
  pointer pcVar2;
  iterator iVar3;
  StreamReader *pSVar4;
  color4h cVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  color4h value;
  color4h value_1;
  color4h local_58;
  string local_50;
  
  pcVar2 = (result->
           super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>).
      _M_impl.super__Vector_impl_data._M_finish != pcVar2) {
    (result->super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
    )._M_impl.super__Vector_impl_data._M_finish = pcVar2;
  }
  bVar6 = SkipWhitespaceAndNewline(this,true);
  if (bVar6) {
    bVar6 = ReadBasicType(this,&local_58);
    if (bVar6) {
      iVar3._M_current =
           (result->
           super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->
          super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<tinyusdz::value::color4h,std::allocator<tinyusdz::value::color4h>>::
        _M_realloc_insert<tinyusdz::value::color4h_const&>
                  ((vector<tinyusdz::value::color4h,std::allocator<tinyusdz::value::color4h>> *)
                   result,iVar3,&local_58);
      }
      else {
        cVar5._1_7_ = local_58._1_7_;
        cVar5.r.value._0_1_ = (char)local_58.r.value;
        *iVar3._M_current = cVar5;
        ppcVar1 = &(result->
                   super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      do {
        pSVar4 = this->_sr;
        if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
        goto LAB_003b6c57;
        bVar6 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar6) {
          return false;
        }
        bVar6 = Char1(this,(char *)&local_58);
        if (!bVar6) {
          return false;
        }
        if ((char)local_58.r.value == sep) {
          bVar6 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar6) {
            return false;
          }
          bVar6 = LookChar1(this,(char *)&local_50);
          if (!bVar6) {
            return false;
          }
          iVar7 = 3;
          if ((char)local_50._M_dataplus._M_p != end_symbol) goto LAB_003b6bd7;
        }
        else {
LAB_003b6bd7:
          if ((char)local_58.r.value != sep) {
            pSVar4 = this->_sr;
            if ((0 < (long)pSVar4->idx_) && (uVar8 = pSVar4->idx_ - 1, uVar8 <= pSVar4->length_)) {
              pSVar4->idx_ = uVar8;
            }
            goto LAB_003b6c57;
          }
          bVar6 = SkipWhitespaceAndNewline(this,true);
          if (!bVar6) {
            return false;
          }
          bVar6 = ReadBasicType(this,(color4h *)&local_50);
          iVar7 = 3;
          if (bVar6) {
            iVar3._M_current =
                 (result->
                 super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (result->
                super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<tinyusdz::value::color4h,std::allocator<tinyusdz::value::color4h>>::
              _M_realloc_insert<tinyusdz::value::color4h_const&>
                        ((vector<tinyusdz::value::color4h,std::allocator<tinyusdz::value::color4h>>
                          *)result,iVar3,(color4h *)&local_50);
            }
            else {
              *iVar3._M_current = (color4h)local_50._M_dataplus._M_p;
              ppcVar1 = &(result->
                         super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppcVar1 = *ppcVar1 + 1;
            }
            iVar7 = 0;
          }
        }
      } while (iVar7 == 0);
      if (iVar7 == 1) {
        return false;
      }
LAB_003b6c57:
      if ((result->
          super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>).
          _M_impl.super__Vector_impl_data._M_start !=
          (result->
          super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        return true;
      }
      pcVar10 = "Empty array.\n";
      pcVar9 = "";
    }
    else {
      pcVar10 = "Not starting with the value of requested type.\n";
      pcVar9 = "";
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar10,pcVar9);
    PushError(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}